

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<true,duckdb::interval_t,duckdb::NotEquals>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  long lVar8;
  long lVar9;
  const_reference pvVar10;
  idx_t iVar11;
  idx_t iVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  idx_t iVar16;
  bool bVar17;
  value_type rhs_offset_in_row;
  interval_t *lhs_data;
  idx_t entry_idx;
  uchar **rhs_locations;
  idx_t local_80;
  idx_t local_78;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar10 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar5 = *pvVar10;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = *no_match_count;
      psVar6 = sel->sel_vector;
      psVar7 = pSVar2->sel_vector;
      local_80 = 0;
      iVar16 = 0;
      do {
        iVar11 = iVar16;
        if (psVar6 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar6[iVar16];
        }
        iVar12 = iVar11;
        if (psVar7 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar7[iVar11];
        }
        lVar8 = *(long *)(pdVar4 + iVar11 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar8 + (col_idx >> 3))) == 0) {
LAB_015db0dc:
          *no_match_count = local_78 + 1;
          no_match_sel->sel_vector[local_78] = (sel_t)iVar11;
          local_78 = local_78 + 1;
        }
        else {
          piVar13 = (int *)(pdVar3 + iVar12 * 0x10);
          lVar9 = *(long *)(lVar8 + vVar5);
          lVar8 = *(long *)(lVar8 + 8 + vVar5);
          if (((*piVar13 == (int)lVar9) && (piVar13[1] == (int)((ulong)lVar9 >> 0x20))) &&
             (*(long *)(piVar13 + 2) == lVar8)) goto LAB_015db0dc;
          lVar14 = (long)piVar13[1] + *(long *)(piVar13 + 2) / 86400000000;
          lVar15 = (lVar9 >> 0x20) + lVar8 / 86400000000;
          if ((((long)*piVar13 + lVar14 / 0x1e == (long)(int)lVar9 + lVar15 / 0x1e) &&
              (lVar14 % 0x1e == lVar15 % 0x1e)) &&
             (*(long *)(piVar13 + 2) % 86400000000 == lVar8 % 86400000000)) goto LAB_015db0dc;
          psVar6[local_80] = (sel_t)iVar11;
          local_80 = local_80 + 1;
        }
        iVar16 = iVar16 + 1;
        if (count == iVar16) {
          return local_80;
        }
      } while( true );
    }
  }
  else if (count != 0) {
    local_78 = *no_match_count;
    psVar6 = sel->sel_vector;
    psVar7 = pSVar2->sel_vector;
    puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    local_80 = 0;
    iVar16 = 0;
    do {
      iVar11 = iVar16;
      if (psVar6 != (sel_t *)0x0) {
        iVar11 = (idx_t)psVar6[iVar16];
      }
      iVar12 = iVar11;
      if (psVar7 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar7[iVar11];
      }
      if (puVar1 == (unsigned_long *)0x0) {
        bVar17 = false;
      }
      else {
        bVar17 = (puVar1[iVar12 >> 6] >> (iVar12 & 0x3f) & 1) == 0;
      }
      if ((bVar17) ||
         (lVar8 = *(long *)(pdVar4 + iVar11 * 8),
         ((uint)*(byte *)(lVar8 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) == 0)) {
LAB_015daf12:
        *no_match_count = local_78 + 1;
        no_match_sel->sel_vector[local_78] = (sel_t)iVar11;
        local_78 = local_78 + 1;
      }
      else {
        piVar13 = (int *)(pdVar3 + iVar12 * 0x10);
        lVar9 = *(long *)(lVar8 + vVar5);
        lVar8 = *(long *)(lVar8 + 8 + vVar5);
        if ((*piVar13 == (int)lVar9) &&
           ((piVar13[1] == (int)((ulong)lVar9 >> 0x20) && (*(long *)(piVar13 + 2) == lVar8))))
        goto LAB_015daf12;
        lVar14 = (long)piVar13[1] + *(long *)(piVar13 + 2) / 86400000000;
        lVar15 = (lVar9 >> 0x20) + lVar8 / 86400000000;
        if (((long)*piVar13 + lVar14 / 0x1e == (long)(int)lVar9 + lVar15 / 0x1e) &&
           ((lVar14 % 0x1e == lVar15 % 0x1e &&
            (*(long *)(piVar13 + 2) % 86400000000 == lVar8 % 86400000000)))) goto LAB_015daf12;
        psVar6[local_80] = (sel_t)iVar11;
        local_80 = local_80 + 1;
      }
      iVar16 = iVar16 + 1;
      if (count == iVar16) {
        return local_80;
      }
    } while( true );
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}